

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O0

size_t utf8_check_first(char byte)

{
  uchar u;
  size_t sStack_10;
  char byte_local;
  
  if ((byte)byte < 0x80) {
    sStack_10 = 1;
  }
  else if (((byte)byte < 0x80) || (0xbf < (byte)byte)) {
    if ((byte == -0x40) || (byte == -0x3f)) {
      sStack_10 = 0;
    }
    else if (((byte)byte < 0xc2) || (0xdf < (byte)byte)) {
      if (((byte)byte < 0xe0) || (0xef < (byte)byte)) {
        if (((byte)byte < 0xf0) || (0xf4 < (byte)byte)) {
          sStack_10 = 0;
        }
        else {
          sStack_10 = 4;
        }
      }
      else {
        sStack_10 = 3;
      }
    }
    else {
      sStack_10 = 2;
    }
  }
  else {
    sStack_10 = 0;
  }
  return sStack_10;
}

Assistant:

size_t utf8_check_first(char byte)
{
    unsigned char u = (unsigned char)byte;

    if(u < 0x80)
        return 1;

    if(0x80 <= u && u <= 0xBF) {
        /* second, third or fourth byte of a multi-byte
           sequence, i.e. a "continuation byte" */
        return 0;
    }
    else if(u == 0xC0 || u == 0xC1) {
        /* overlong encoding of an ASCII byte */
        return 0;
    }
    else if(0xC2 <= u && u <= 0xDF) {
        /* 2-byte sequence */
        return 2;
    }

    else if(0xE0 <= u && u <= 0xEF) {
        /* 3-byte sequence */
        return 3;
    }
    else if(0xF0 <= u && u <= 0xF4) {
        /* 4-byte sequence */
        return 4;
    }
    else { /* u >= 0xF5 */
        /* Restricted (start of 4-, 5- or 6-byte sequence) or invalid
           UTF-8 */
        return 0;
    }
}